

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::tracker_request_error
          (torrent *this,tracker_request *r,error_code *ec,operation_t op,string *msg,
          seconds32 retry_interval)

{
  service_type *this_00;
  per_timer_data *ppVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  state_t sVar5;
  time_point32 now;
  char *pcVar6;
  session_settings *this_01;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  announce_entry *ae_00;
  error_category *peVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  endpoint *ep;
  endpoint *ep_00;
  endpoint *ep_01;
  bool local_249;
  undefined1 local_1d8 [31];
  protocol_version hash_version_1;
  announce_endpoint *aep_1;
  endpoint local_endpoint_1;
  announce_entry *ae_1;
  _Head_base<0UL,_libtorrent::aux::hash_picker_*,_false> local_170;
  element_type *local_168;
  __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
  local_160;
  error_code local_158;
  endpoint local_144;
  string local_128;
  string local_108;
  error_condition local_e8;
  string local_d8;
  rep_conflict local_b4;
  service_type *local_b0;
  value_type *a;
  announce_endpoint *aep;
  undefined1 local_98 [7];
  protocol_version hash_version;
  endpoint local_endpoint;
  int fails;
  announce_entry *ae;
  string local_60;
  array<const_bool,_2UL> local_3c;
  container_wrapper<const_bool,_libtorrent::protocol_version,_std::array<const_bool,_2UL>_> local_3a
  ;
  time_type tStack_38;
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  string *msg_local;
  per_timer_data *ppStack_28;
  operation_t op_local;
  error_code *ec_local;
  tracker_request *r_local;
  torrent *this_local;
  seconds32 retry_interval_local;
  
  tStack_38.__d.__r = (duration)(duration)msg;
  msg_local._7_1_ = op;
  ppStack_28 = (per_timer_data *)ec;
  ec_local = (error_code *)r;
  r_local = (tracker_request *)this;
  this_local._4_4_ = retry_interval.__r;
  local_3c._M_elems[0] = info_hash_t::has_v1(&this->m_info_hash);
  local_3c._M_elems[1] = info_hash_t::has_v2(&this->m_info_hash);
  container_wrapper<const_bool,_libtorrent::protocol_version,_std::array<const_bool,_2UL>_>::
  container_wrapper(&local_3a,&local_3c);
  uVar3 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((uVar3 & 1) != 0) {
    uVar3 = boost::system::error_code::value((error_code *)ppStack_28);
    boost::system::error_code::message_abi_cxx11_(&local_60,(error_code *)ppStack_28);
    uVar7 = ::std::__cxx11::string::c_str();
    pcVar6 = operation_name(msg_local._7_1_);
    uVar8 = ::std::__cxx11::string::c_str();
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** tracker error: (%d) %s [%s] %s",(ulong)uVar3,uVar7,pcVar6,uVar8);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  ae._2_1_ = *(uchar *)((long)&ec_local[7].cat_ + 3);
  ae._1_1_ = 1;
  ae._3_1_ = libtorrent::flags::operator&
                       (ae._2_1_,(bitfield_flag<unsigned_char,_libtorrent::aux::tracker_request_flags_tag,_void>
                                  )0x1);
  bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)((long)&ae + 3));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    ae_00 = tracker_list::find_tracker(&this->m_trackers,(string *)ec_local);
    ppVar1 = ppStack_28;
    peVar9 = http_category();
    boost::system::error_code::error_code
              ((error_code *)((long)&local_endpoint_1.impl_.data_.v6.sin6_addr.__in6_u + 0xc),0x19a,
               peVar9);
    local_249 = boost::system::operator==
                          ((error_code *)ppVar1,
                           (error_code *)
                           ((long)&local_endpoint_1.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
    local_249 = local_249 && ae_00 != (announce_entry *)0x0;
    if (local_249) {
      tracker_list::dont_try_again(&this->m_trackers,ae_00);
    }
    iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    bVar2 = alert_manager::should_post<libtorrent::scrape_failed_alert>
                      ((alert_manager *)CONCAT44(extraout_var_01,iVar4));
    if ((bVar2) || ((ec_local[0xf].val_ & 0x100) != 0)) {
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                ((basic_endpoint<boost::asio::ip::tcp> *)((long)&aep_1 + 4));
      if ((ae_00 != (announce_entry *)0x0) &&
         (register0x00000000 =
               (element_type *)
               announce_entry::find_endpoint(ae_00,(listen_socket_handle *)(ec_local + 0xe)),
         register0x00000000 != (element_type *)0x0)) {
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=
                  ((basic_endpoint<boost::asio::ip::tcp> *)((long)&aep_1 + 4),
                   (basic_endpoint<boost::asio::ip::tcp> *)register0x00000000);
      }
      bVar2 = digest32<160L>::operator==
                        ((digest32<160L> *)&ec_local[0xb].cat_,&(this->m_info_hash).v1);
      local_1d8[0x17] = !bVar2;
      iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_1d8);
      alert_manager::
      emplace_alert<libtorrent::scrape_failed_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::protocol_version&,std::__cxx11::string_const&,boost::system::error_code_const&>
                ((alert_manager *)CONCAT44(extraout_var_02,iVar4),(torrent_handle *)local_1d8,
                 (basic_endpoint<boost::asio::ip::tcp> *)((long)&aep_1 + 4),local_1d8 + 0x17,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ec_local,
                 (error_code *)ppStack_28);
      torrent_handle::~torrent_handle((torrent_handle *)local_1d8);
    }
  }
  else {
    register0x00000000 = tracker_list::find_tracker(&this->m_trackers,(string *)ec_local);
    local_endpoint.impl_.data_._20_4_ = 0;
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::tcp> *)local_98);
    aep._7_1_ = 0;
    if (stack0xffffffffffffff88 != (announce_entry *)0x0) {
      a = (value_type *)
          announce_entry::find_endpoint
                    (stack0xffffffffffffff88,(listen_socket_handle *)(ec_local + 0xe));
      if ((announce_endpoint *)a == (announce_endpoint *)0x0) {
        bVar2 = listen_socket_handle::operator_cast_to_bool
                          ((listen_socket_handle *)(ec_local + 0xe));
        if (bVar2) {
          uVar7 = ::std::__cxx11::string::c_str();
          listen_socket_handle::get_local_endpoint
                    (&local_144,(listen_socket_handle *)(ec_local + 0xe));
          print_endpoint_abi_cxx11_(&local_128,(aux *)&local_144,ep_01);
          uVar8 = ::std::__cxx11::string::c_str();
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"*** no matching endpoint for request [%s, %s]",uVar7,uVar8);
          ::std::__cxx11::string::~string((string *)&local_128);
        }
      }
      else {
        bVar2 = digest32<160L>::operator==
                          ((digest32<160L> *)&ec_local[0xb].cat_,&(this->m_info_hash).v1);
        aep._7_1_ = !bVar2;
        local_b0 = (service_type *)
                   container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                   ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                 *)&a->last_error,aep._7_1_);
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=
                  ((basic_endpoint<boost::asio::ip::tcp> *)local_98,
                   (basic_endpoint<boost::asio::ip::tcp> *)a);
        this_00 = local_b0;
        this_01 = settings(this);
        iVar4 = session_settings::get_int(this_01,0x406c);
        local_b4 = this_local._4_4_;
        announce_infohash::failed((announce_infohash *)this_00,iVar4,this_local._4_4_);
        (local_b0->
        super_execution_context_service_base<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>_>
        ).super_service.next_ = (service *)(ppStack_28->op_queue_).front_;
        (local_b0->timer_queue_).super_timer_queue_base._vptr_timer_queue_base =
             (_func_int **)(ppStack_28->op_queue_).back_;
        ::std::__cxx11::string::operator=((string *)local_b0,(string *)tStack_38.__d.__r);
        local_endpoint.impl_.data_._20_4_ =
             ZEXT14((byte)*(undefined2 *)
                           ((long)&(local_b0->timer_queue_).heap_.
                                   super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>::heap_entry>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 4) & 0x7f);
        print_endpoint_abi_cxx11_(&local_d8,(aux *)a,ep);
        uVar7 = ::std::__cxx11::string::c_str();
        uVar8 = ::std::__cxx11::string::c_str();
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** increment tracker fail count [ep: %s url: %s %d]",uVar7,uVar8,
                   (ulong)((byte)*(undefined2 *)
                                  ((long)&(local_b0->timer_queue_).heap_.
                                          super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>::heap_entry>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 4) & 0x7f));
        ::std::__cxx11::string::~string((string *)&local_d8);
        ppVar1 = ppStack_28;
        boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                  (&local_e8,address_family_not_supported,(type *)0x0);
        bVar2 = boost::system::operator==((error_code *)ppVar1,&local_e8);
        if (bVar2) {
          *(byte *)&a[2].last_error.val_ = (byte)a[2].last_error.val_ & 0xfe;
          print_endpoint_abi_cxx11_(&local_108,(aux *)a,ep_00);
          uVar7 = ::std::__cxx11::string::c_str();
          uVar8 = ::std::__cxx11::string::c_str();
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"*** disabling endpoint [ep: %s url: %s ]",uVar7,uVar8);
          ::std::__cxx11::string::~string((string *)&local_108);
        }
      }
      ppVar1 = ppStack_28;
      peVar9 = http_category();
      boost::system::error_code::error_code(&local_158,0x19a,peVar9);
      bVar2 = boost::system::operator==((error_code *)ppVar1,&local_158);
      if (bVar2) {
        tracker_list::dont_try_again(&this->m_trackers,stack0xffffffffffffff88);
      }
      local_160._M_current =
           (announce_endpoint *)
           ::std::
           vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
           ::begin(&stack0xffffffffffffff88->endpoints);
      local_168 = (element_type *)
                  ::std::
                  vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                  ::end(&stack0xffffffffffffff88->endpoints);
      local_170._M_head_impl = (hash_picker *)&local_3a;
      bVar2 = ::std::
              all_of<__gnu_cxx::__normal_iterator<libtorrent::aux::announce_endpoint*,std::vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>>,libtorrent::aux::torrent::tracker_request_error(libtorrent::aux::tracker_request_const&,boost::system::error_code_const&,libtorrent::operation_t,std::__cxx11::string_const&,std::chrono::duration<int,std::ratio<1l,1l>>)::__0>
                        (local_160,
                         (__normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
                          )local_168,(anon_class_8_1_d2284f93)local_170._M_head_impl);
      if (bVar2) {
        tracker_list::deprioritize_tracker(&this->m_trackers,stack0xffffffffffffff88);
      }
    }
    iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    bVar2 = alert_manager::should_post<libtorrent::tracker_error_alert>
                      ((alert_manager *)CONCAT44(extraout_var,iVar4));
    if ((bVar2) || ((ec_local[0xf].val_ & 0x100) != 0)) {
      iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)&ae_1);
      alert_manager::
      emplace_alert<libtorrent::tracker_error_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int&,libtorrent::protocol_version&,std::__cxx11::string_const&,libtorrent::operation_t_const&,boost::system::error_code_const&,std::__cxx11::string_const&>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar4),(torrent_handle *)&ae_1,
                 (basic_endpoint<boost::asio::ip::tcp> *)local_98,
                 (int *)((long)&local_endpoint.impl_.data_ + 0x14),
                 (protocol_version *)((long)&aep + 7),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ec_local,
                 (operation_t *)((long)&msg_local + 7),(error_code *)ppStack_28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 tStack_38.__d.__r);
      torrent_handle::~torrent_handle((torrent_handle *)&ae_1);
    }
  }
  if (((((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) &&
       (bVar2 = is_paused(this), !bVar2)) && (sVar5 = state(this), sVar5 != checking_files)) ||
     (*(char *)((long)&ec_local[7].cat_ + 2) == '\x03')) {
    announce_with_tracker(this,*(event_t *)((long)&ec_local[7].cat_ + 2));
  }
  now = time_now32();
  update_tracker_timer(this,now);
  return;
}

Assistant:

void torrent::tracker_request_error(tracker_request const& r
		, error_code const& ec, operation_t const op, std::string const& msg
		, seconds32 const retry_interval)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

// some older versions of clang had a bug where it would fire this warning here
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
		aux::array<bool const, num_protocols, protocol_version> const supports_protocol
		{ {
			m_info_hash.has_v1(),
			m_info_hash.has_v2()
		} };
#ifdef __clang__
#pragma clang diagnostic pop
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** tracker error: (%d) %s [%s] %s", ec.value()
				, ec.message().c_str(), operation_name(op), msg.c_str());
		}
#endif
		if (!(r.kind & tracker_request::scrape_request))
		{
			// announce request
			aux::announce_entry* ae = m_trackers.find_tracker(r.url);
			int fails = 0;
			tcp::endpoint local_endpoint;
			protocol_version hash_version = protocol_version::V1;
			if (ae)
			{
				auto* aep = ae->find_endpoint(r.outgoing_socket);
				if (aep)
				{
					hash_version = r.info_hash == m_info_hash.v1
						? protocol_version::V1 : protocol_version::V2;
					auto& a = aep->info_hashes[hash_version];
					local_endpoint = aep->local_endpoint;
					a.failed(settings().get_int(settings_pack::tracker_backoff)
						, retry_interval);
					a.last_error = ec;
					a.message = msg;
					fails = a.fails;

#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** increment tracker fail count [ep: %s url: %s %d]"
						, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str(), a.fails);
#endif
					if (ec == boost::system::errc::address_family_not_supported)
					{
						// don't try to announce from this endpoint again
						aep->enabled = false;
#ifndef TORRENT_DISABLE_LOGGING
						debug_log("*** disabling endpoint [ep: %s url: %s ]"
							, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str());
#endif
					}
				}
				else if (r.outgoing_socket)
				{
#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** no matching endpoint for request [%s, %s]"
						, r.url.c_str(), print_endpoint(r.outgoing_socket.get_local_endpoint()).c_str());
#endif
				}

				// never talk to this tracker again
				if (ec == error_code(410, http_category())) m_trackers.dont_try_again(ae);

				// if all endpoints fail, then we de-prioritize the tracker and try
				// the next one in the tier
				if (std::all_of(ae->endpoints.begin(), ae->endpoints.end()
					, [&](aux::announce_endpoint const& ep)
					{
						for (protocol_version const ih : all_versions)
							if (supports_protocol[ih] && ep.info_hashes[ih].is_working())
								return false;
						return true;
					}))
				{
					m_trackers.deprioritize_tracker(ae);
				}
			}
			if (m_ses.alerts().should_post<tracker_error_alert>()
				|| r.triggered_manually)
			{
				m_ses.alerts().emplace_alert<tracker_error_alert>(get_handle()
					, local_endpoint, fails, hash_version, r.url, op, ec, msg);
			}
		}
		else
		{
			aux::announce_entry* ae = m_trackers.find_tracker(r.url);

			// scrape request
			if (ec == error_code(410, http_category()) && ae)
				m_trackers.dont_try_again(ae);

			// if this was triggered manually we need to post this unconditionally,
			// since the client expects a response from its action, regardless of
			// whether all tracker events have been enabled by the alert mask
			if (m_ses.alerts().should_post<scrape_failed_alert>()
				|| r.triggered_manually)
			{
				tcp::endpoint local_endpoint;
				if (ae)
				{
					auto const* aep = ae->find_endpoint(r.outgoing_socket);
					if (aep != nullptr) local_endpoint = aep->local_endpoint;
				}

				protocol_version hash_version = r.info_hash == m_info_hash.v1
					? protocol_version::V1 : protocol_version::V2;

				m_ses.alerts().emplace_alert<scrape_failed_alert>(get_handle()
					, local_endpoint, hash_version, r.url, ec);
			}
		}
		// announce to the next working tracker
		// We may have changed state into checking by now, in which case we
		// shouldn't keep trying to announce
		if ((!m_abort && !is_paused() && state() != torrent_status::checking_files)
			|| r.event == event_t::stopped)
		{
			announce_with_tracker(r.event);
		}
		update_tracker_timer(aux::time_now32());
	}